

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBinaryStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  int iVar1;
  char *pcVar2;
  sxi32 sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  long lStack_48;
  int c;
  sxi64 nVal;
  int isNeg;
  char *zEnd;
  char *zIn;
  char **zRest_local;
  void *pOutVal_local;
  char *pcStack_10;
  sxu32 nLen_local;
  char *zSrc_local;
  
  bVar8 = false;
  lStack_48 = 0;
  pcVar4 = zSrc + nLen;
  pcStack_10 = zSrc;
  while( true ) {
    bVar7 = false;
    if (pcStack_10 < pcVar4) {
      ppuVar5 = __ctype_b_loc();
      bVar7 = ((*ppuVar5)[(int)*pcStack_10] & 0x2000) != 0;
    }
    if (!bVar7) break;
    pcStack_10 = pcStack_10 + 1;
  }
  if ((pcStack_10 < pcVar4) && ((*pcStack_10 == '-' || (*pcStack_10 == '+')))) {
    bVar8 = *pcStack_10 == '-';
    pcStack_10 = pcStack_10 + 1;
  }
  if (((pcStack_10 < pcVar4 + -2) && (*pcStack_10 == '0')) &&
     ((pcStack_10[1] == 'b' || (pcStack_10[1] == 'B')))) {
    pcStack_10 = pcStack_10 + 2;
  }
  while( true ) {
    pcVar2 = pcStack_10;
    bVar7 = false;
    if (pcStack_10 < pcVar4) {
      bVar7 = *pcStack_10 == '0';
    }
    if (!bVar7) break;
    pcStack_10 = pcStack_10 + 1;
  }
  for (; (pcVar6 = pcStack_10, pcStack_10 < pcVar4 &&
         (((*pcStack_10 == '1' || (*pcStack_10 == '0')) &&
          (iVar1 = (int)pcVar2, (int)pcStack_10 - iVar1 < 0x3f)))); pcStack_10 = pcStack_10 + 4) {
    lStack_48 = lStack_48 * 2 + (long)(*pcStack_10 + -0x30);
    pcVar6 = pcStack_10 + 1;
    if (((pcVar4 <= pcVar6) || ((*pcVar6 != '1' && (*pcVar6 != '0')))) ||
       (0x3e < (int)pcVar6 - iVar1)) break;
    lStack_48 = lStack_48 * 2 + (long)(*pcVar6 + -0x30);
    pcVar6 = pcStack_10 + 2;
    if (((pcVar4 <= pcVar6) || ((*pcVar6 != '1' && (*pcVar6 != '0')))) ||
       (0x3e < (int)pcVar6 - iVar1)) break;
    lStack_48 = lStack_48 * 2 + (long)(*pcVar6 + -0x30);
    pcVar6 = pcStack_10 + 3;
    if ((pcVar4 <= pcVar6) ||
       (((*pcVar6 != '1' && (*pcVar6 != '0')) || (0x3e < (int)pcVar6 - iVar1)))) break;
    lStack_48 = lStack_48 * 2 + (long)(*pcVar6 + -0x30);
  }
  while( true ) {
    pcStack_10 = pcVar6;
    bVar7 = false;
    if (pcStack_10 < pcVar4) {
      ppuVar5 = __ctype_b_loc();
      bVar7 = ((*ppuVar5)[(int)*pcStack_10] & 0x2000) != 0;
    }
    if (!bVar7) break;
    pcVar6 = pcStack_10 + 1;
  }
  if (zRest != (char **)0x0) {
    *zRest = pcStack_10;
  }
  if (pOutVal != (void *)0x0) {
    if ((bVar8) && (lStack_48 != 0)) {
      lStack_48 = -lStack_48;
    }
    *(long *)pOutVal = lStack_48;
  }
  sVar3 = -0xc;
  if (pcVar4 <= pcStack_10) {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 SyBinaryStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
	int c;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	if( zSrc < &zEnd[-2] && zSrc[0] == '0' && (zSrc[1] == 'b' || zSrc[1] == 'B') ){
		/* Bypass binary prefix */
		zSrc += sizeof(char) * 2;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}